

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O2

void cmn_live_update(cmn_t *cmn)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (0 < cmn->nframe) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
            ,0x78,"Update from < ");
    for (lVar4 = 0; lVar4 < cmn->veclen; lVar4 = lVar4 + 1) {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar4]);
    }
    uVar3 = 0;
    err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
    iVar1 = cmn->nframe;
    uVar2 = 0;
    if (0 < cmn->veclen) {
      uVar2 = (ulong)(uint)cmn->veclen;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      cmn->cmn_mean[uVar3] = (mfcc_t)((float)cmn->sum[uVar3] / (float)iVar1);
    }
    if (800 < iVar1) {
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        cmn->sum[uVar3] = (mfcc_t)((float)cmn->sum[uVar3] * (1.0 / (float)iVar1) * 500.0);
      }
      cmn->nframe = 500;
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
            ,0x8a,"Update to   < ");
    for (lVar4 = 0; lVar4 < cmn->veclen; lVar4 = lVar4 + 1) {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar4]);
    }
    err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
    return;
  }
  return;
}

Assistant:

void
cmn_live_update(cmn_t *cmn)
{
    mfcc_t sf;
    int32 i;

    if (cmn->nframe <= 0)
        return;

    E_INFO("Update from < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");

    /* Update mean buffer */
    sf = FLOAT2MFCC(1.0) / cmn->nframe;
    for (i = 0; i < cmn->veclen; i++)
        cmn->cmn_mean[i] = cmn->sum[i] / cmn->nframe; /* sum[i] * sf; */

    /* Make the accumulation decay exponentially */
    if (cmn->nframe > CMN_WIN_HWM) {
        sf = CMN_WIN * sf;
        for (i = 0; i < cmn->veclen; i++)
            cmn->sum[i] = MFCCMUL(cmn->sum[i], sf);
        cmn->nframe = CMN_WIN;
    }

    E_INFO("Update to   < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");
}